

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::StorageCompatibilityVersionSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  string version_string;
  SerializationCompatibility serialization_compatibility;
  string local_60;
  SerializationCompatibility local_40;
  
  Value::GetValue<std::__cxx11::string>(&local_60,input);
  SerializationCompatibility::FromString(&local_40,&local_60);
  ::std::__cxx11::string::_M_assign((string *)&(config->options).serialization_compatibility);
  (config->options).serialization_compatibility.manually_set = local_40.manually_set;
  (config->options).serialization_compatibility.serialization_version =
       local_40.serialization_version;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.duckdb_version._M_dataplus._M_p != &local_40.duckdb_version.field_2) {
    operator_delete(local_40.duckdb_version._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StorageCompatibilityVersionSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto version_string = input.GetValue<string>();
	auto serialization_compatibility = SerializationCompatibility::FromString(version_string);
	config.options.serialization_compatibility = serialization_compatibility;
}